

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

int htoi(char *str,int nb)

{
  int iVar1;
  __int32_t **pp_Var2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)nb;
  if (nb < 1) {
    uVar3 = uVar4;
  }
  uVar5 = 0;
  do {
    if (uVar3 == uVar4) {
      return uVar5;
    }
    pp_Var2 = __ctype_toupper_loc();
    iVar1 = (int)(char)(*pp_Var2)[str[uVar4]];
    if (iVar1 - 0x30U < 10) {
      uVar5 = uVar5 << 4 | iVar1 - 0x30U;
    }
    else {
      if (5 < iVar1 - 0x41U) {
        return -1;
      }
      uVar5 = (uVar5 * 0x10 + iVar1) - 0x37;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int
htoi(char *str, int nb)
{
	char c;
	int val;
	int i;

	val = 0;

	for (i = 0; i < nb; i++) {
		 c = toupper(str[i]);

		if ((c >= '0') && (c <= '9'))
			val = (val << 4) + (c - '0');
		else if ((c >= 'A') && (c <= 'F'))
			val = (val << 4) + (c - 'A' + 10);
		else
			return (-1);
	}

	/* ok */
	return (val);
}